

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Definition.cpp
# Opt level: O0

void __thiscall
slang::ast::Definition::Definition
          (Definition *this,Scope *scope,LookupLocation lookupLocation,
          ModuleDeclarationSyntax *syntax,NetType *defaultNetType,UnconnectedDrive unconnectedDrive,
          optional<slang::TimeScale> directiveTimeScale,SyntaxTree *syntaxTree)

{
  MemberSyntax *this_00;
  NetType *pNVar1;
  ModuleDeclarationSyntax *pMVar2;
  _Storage<slang::TimeScale,_true> _Var3;
  bool bVar4;
  bool hasPrecision;
  SymbolIndex SVar5;
  DefinitionKind DVar6;
  VariableLifetime VVar7;
  ModuleHeaderSyntax *pMVar8;
  iterator ppMVar9;
  TimeUnitsDeclarationSyntax *syntax_00;
  ModportDeclarationSyntax *pMVar10;
  ParameterDeclarationStatementSyntax *pPVar11;
  ParameterDeclarationBaseSyntax *pPVar12;
  optional<slang::TimeScale> directiveTimeScale_00;
  Info *extraout_RDX;
  bool bVar13;
  Token token;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar14;
  iterator iVar15;
  string_view sVar16;
  pair<ska::detailv3::sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>::templated_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
  pVar17;
  LookupLocation lookupLocation_00;
  bool local_291;
  bool local_201;
  bool isLocal;
  not_null<slang::syntax::ParameterDeclarationBaseSyntax_*> declaration;
  string_view local_160;
  ModportItemSyntax *local_150;
  ModportItemSyntax *item;
  iterator __end4;
  iterator __begin4;
  SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *__range4;
  MemberSyntax *member;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  optional<slang::SourceRange> precisionRange;
  optional<slang::SourceRange> unitsRange;
  bool first;
  bool hasPortParams;
  VariableLifetime local_8c;
  SemanticFacts *local_88;
  Info *pIStack_80;
  _Optional_payload_base<slang::ast::VariableLifetime> local_78;
  SourceLocation local_70;
  string_view local_68;
  ModuleHeaderSyntax *local_58;
  ModuleHeaderSyntax *header;
  NetType *local_40;
  NetType *defaultNetType_local;
  ModuleDeclarationSyntax *syntax_local;
  Scope *scope_local;
  Definition *this_local;
  undefined1 auStack_18 [3];
  optional<slang::TimeScale> directiveTimeScale_local;
  LookupLocation lookupLocation_local;
  
  _auStack_18 = lookupLocation.scope;
  this_local._7_1_ =
       directiveTimeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
       super__Optional_payload_base<slang::TimeScale>._M_engaged;
  this_local._3_4_ =
       directiveTimeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
       super__Optional_payload_base<slang::TimeScale>._M_payload;
  local_40 = defaultNetType;
  defaultNetType_local = (NetType *)syntax;
  syntax_local = (ModuleDeclarationSyntax *)scope;
  scope_local = (Scope *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->name);
  SourceLocation::SourceLocation(&this->location);
  this->syntax = (ModuleDeclarationSyntax *)defaultNetType_local;
  this->defaultNetType = local_40;
  this->scope = (Scope *)syntax_local;
  this->unconnectedDrive = unconnectedDrive;
  TimeScale::TimeScale(&this->timeScale);
  SmallVector<slang::ast::Definition::ParameterDecl,_8UL>::SmallVector(&this->parameters);
  ska::
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::flat_hash_set(&this->modports);
  nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::
  span<true,_0>(&this->attributes);
  this->syntaxTree = syntaxTree;
  this->instantiated = false;
  local_58 = not_null<slang::syntax::ModuleHeaderSyntax_*>::operator*
                       ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)
                        &defaultNetType_local->declaredType);
  local_68 = parsing::Token::valueText(&local_58->name);
  this->name = local_68;
  local_70 = parsing::Token::location(&local_58->name);
  this->location = local_70;
  SVar5 = LookupLocation::getIndex((LookupLocation *)auStack_18);
  this->indexInScope = SVar5;
  DVar6 = SemanticFacts::getDefinitionKind
                    ((SyntaxKind)(defaultNetType_local->super_Symbol).name._M_len);
  this->definitionKind = DVar6;
  local_88 = *(SemanticFacts **)&local_58->lifetime;
  pIStack_80 = (local_58->lifetime).info;
  token.info = extraout_RDX;
  token._0_8_ = pIStack_80;
  local_78 = (_Optional_payload_base<slang::ast::VariableLifetime>)
             SemanticFacts::getVariableLifetime(local_88,token);
  local_8c = Static;
  VVar7 = std::optional<slang::ast::VariableLifetime>::value_or<slang::ast::VariableLifetime>
                    ((optional<slang::ast::VariableLifetime> *)&local_78,&local_8c);
  this->defaultLifetime = VVar7;
  syntax_01 = slang::syntax::SyntaxList::operator_cast_to_span
                        ((SyntaxList *)&(defaultNetType_local->super_Symbol).name._M_str);
  lookupLocation_00.index = lookupLocation.index;
  lookupLocation_00.scope = _auStack_18;
  lookupLocation_00._12_4_ = 0;
  sVar14 = AttributeSymbol::fromSyntax(syntax_01,(Scope *)syntax_local,lookupLocation_00);
  this->attributes = sVar14;
  pMVar8 = not_null<slang::syntax::ModuleHeaderSyntax_*>::operator->
                     ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)
                      &defaultNetType_local->declaredType);
  local_201 = false;
  if (pMVar8->ports != (PortListSyntax *)0x0) {
    pMVar8 = not_null<slang::syntax::ModuleHeaderSyntax_*>::operator->
                       ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)
                        &defaultNetType_local->declaredType);
    local_201 = (pMVar8->ports->super_SyntaxNode).kind == NonAnsiPortList;
  }
  this->hasNonAnsiPorts = local_201;
  bVar13 = local_58->parameters != (ParameterPortListSyntax *)0x0;
  if (bVar13) {
    ParameterBuilder::createDecls
              ((Scope *)syntax_local,local_58->parameters,
               &(this->parameters).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>);
  }
  unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._22_1_ = 1;
  std::optional<slang::SourceRange>::optional
            ((optional<slang::SourceRange> *)
             &precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::SourceRange>._M_engaged);
  std::optional<slang::SourceRange>::optional((optional<slang::SourceRange> *)&__range2);
  pNVar1 = defaultNetType_local;
  __end2 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                     ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
                      &(defaultNetType_local->declaredType).initializerSyntax);
  ppMVar9 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                      ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
                       &(pNVar1->declaredType).initializerSyntax);
  for (; bVar4 = (bool)this_local._7_1_, _Var3 = this_local._3_4_, pMVar2 = syntax_local,
      __end2 != ppMVar9; __end2 = __end2 + 1) {
    this_00 = *__end2;
    if ((this_00->super_SyntaxNode).kind == TimeUnitsDeclaration) {
      syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::TimeUnitsDeclarationSyntax>
                            (&this_00->super_SyntaxNode);
      SemanticFacts::populateTimeScale
                (&this->timeScale,(Scope *)pMVar2,syntax_00,
                 (optional<slang::SourceRange> *)
                 &precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::SourceRange>._M_engaged,
                 (optional<slang::SourceRange> *)&__range2,
                 (bool)unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                       super__Optional_payload_base<slang::SourceRange>._22_1_);
    }
    else {
      unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._22_1_ = 0;
      if ((this_00->super_SyntaxNode).kind == ModportDeclaration) {
        pMVar10 = slang::syntax::SyntaxNode::as<slang::syntax::ModportDeclarationSyntax>
                            (&this_00->super_SyntaxNode);
        iVar15 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::begin
                           (&pMVar10->items);
        __end4.index = (size_t)iVar15.list;
        iVar15 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::end
                           (&pMVar10->items);
        while( true ) {
          __end4.list = (ParentList *)iVar15.index;
          item = (ModportItemSyntax *)iVar15.list;
          bVar4 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<slang::syntax::ModportItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ModportItemSyntax_*,_unsigned_long,_slang::syntax::ModportItemSyntax_**,_slang::syntax::ModportItemSyntax_*&>
                  ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<slang::syntax::ModportItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ModportItemSyntax_*,_unsigned_long,_slang::syntax::ModportItemSyntax_**,_slang::syntax::ModportItemSyntax_*&>
                                *)&__end4.index,
                               (iterator_base<slang::syntax::ModportItemSyntax_*> *)&item);
          if (!bVar4) break;
          local_150 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::
                      iterator_base<slang::syntax::ModportItemSyntax_*>::operator*
                                ((iterator_base<slang::syntax::ModportItemSyntax_*> *)&__end4.index)
          ;
          sVar16 = parsing::Token::valueText(&local_150->name);
          local_160 = sVar16;
          pVar17 = ska::
                   flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::emplace(&this->modports,&local_160);
          declaration.ptr = (ParameterDeclarationBaseSyntax *)pVar17.first.current;
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<slang::syntax::ModportItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ModportItemSyntax_*,_unsigned_long,_slang::syntax::ModportItemSyntax_**,_slang::syntax::ModportItemSyntax_*&>
          ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<slang::syntax::ModportItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ModportItemSyntax_*,_unsigned_long,_slang::syntax::ModportItemSyntax_**,_slang::syntax::ModportItemSyntax_*&>
                        *)&__end4.index);
          iVar15.index = (size_t)__end4.list;
          iVar15.list = (ParentList *)item;
        }
      }
      else if ((this_00->super_SyntaxNode).kind == ParameterDeclarationStatement) {
        pPVar11 = slang::syntax::SyntaxNode::as<slang::syntax::ParameterDeclarationStatementSyntax>
                            (&this_00->super_SyntaxNode);
        not_null<slang::syntax::ParameterDeclarationBaseSyntax*>::
        not_null<slang::not_null<slang::syntax::ParameterDeclarationBaseSyntax*>&,void>
                  ((not_null<slang::syntax::ParameterDeclarationBaseSyntax*> *)
                   &stack0xfffffffffffffe88,&pPVar11->parameter);
        local_291 = true;
        if (!bVar13) {
          pPVar12 = not_null<slang::syntax::ParameterDeclarationBaseSyntax_*>::operator->
                              ((not_null<slang::syntax::ParameterDeclarationBaseSyntax_*> *)
                               &stack0xfffffffffffffe88);
          local_291 = (pPVar12->keyword).kind == LocalParamKeyword;
        }
        pMVar2 = syntax_local;
        pPVar12 = not_null<slang::syntax::ParameterDeclarationBaseSyntax_*>::operator*
                            ((not_null<slang::syntax::ParameterDeclarationBaseSyntax_*> *)
                             &stack0xfffffffffffffe88);
        ParameterBuilder::createDecls
                  ((Scope *)pMVar2,pPVar12,local_291,false,
                   &(this->parameters).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>)
        ;
      }
    }
  }
  bVar13 = std::optional<slang::SourceRange>::has_value
                     ((optional<slang::SourceRange> *)
                      &precisionRange.super__Optional_base<slang::SourceRange,_true,_true>.
                       _M_payload.super__Optional_payload_base<slang::SourceRange>._M_engaged);
  hasPrecision = std::optional<slang::SourceRange>::has_value
                           ((optional<slang::SourceRange> *)&__range2);
  directiveTimeScale_00.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = bVar4;
  directiveTimeScale_00.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_payload = _Var3;
  SemanticFacts::populateTimeScale
            (&this->timeScale,(Scope *)pMVar2,directiveTimeScale_00,bVar13,hasPrecision);
  return;
}

Assistant:

Definition::Definition(const Scope& scope, LookupLocation lookupLocation,
                       const ModuleDeclarationSyntax& syntax, const NetType& defaultNetType,
                       UnconnectedDrive unconnectedDrive,
                       std::optional<TimeScale> directiveTimeScale, const SyntaxTree* syntaxTree) :
    syntax(syntax),
    defaultNetType(defaultNetType), scope(scope), unconnectedDrive(unconnectedDrive),
    syntaxTree(syntaxTree) {

    // Extract and save various properties of the definition.
    auto& header = *syntax.header;
    name = header.name.valueText();
    location = header.name.location();
    indexInScope = lookupLocation.getIndex();
    definitionKind = SemanticFacts::getDefinitionKind(syntax.kind);
    defaultLifetime =
        SemanticFacts::getVariableLifetime(header.lifetime).value_or(VariableLifetime::Static);
    attributes = AttributeSymbol::fromSyntax(syntax.attributes, scope, lookupLocation);
    hasNonAnsiPorts = syntax.header->ports &&
                      syntax.header->ports->kind == SyntaxKind::NonAnsiPortList;

    // Find all port parameters.
    bool hasPortParams = header.parameters != nullptr;
    if (hasPortParams)
        ParameterBuilder::createDecls(scope, *header.parameters, parameters);

    bool first = true;
    std::optional<SourceRange> unitsRange;
    std::optional<SourceRange> precisionRange;

    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::TimeUnitsDeclaration) {
            SemanticFacts::populateTimeScale(timeScale, scope,
                                             member->as<TimeUnitsDeclarationSyntax>(), unitsRange,
                                             precisionRange, first);
            continue;
        }

        first = false;
        if (member->kind == SyntaxKind::ModportDeclaration) {
            for (auto item : member->as<ModportDeclarationSyntax>().items)
                modports.emplace(item->name.valueText());
        }
        else if (member->kind == SyntaxKind::ParameterDeclarationStatement) {
            auto declaration = member->as<ParameterDeclarationStatementSyntax>().parameter;
            bool isLocal = hasPortParams ||
                           declaration->keyword.kind == TokenKind::LocalParamKeyword;

            ParameterBuilder::createDecls(scope, *declaration, isLocal, /* isPort */ false,
                                          parameters);
        }
    }

    SemanticFacts::populateTimeScale(timeScale, scope, directiveTimeScale, unitsRange.has_value(),
                                     precisionRange.has_value());
}